

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atakebune.cpp
# Opt level: O0

void __thiscall Atakebune::Atakebune(Atakebune *this,string *n,int t,int spT)

{
  int spT_00;
  int t_00;
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  int local_20;
  int local_1c;
  int spT_local;
  int t_local;
  string *n_local;
  Atakebune *this_local;
  
  local_20 = spT;
  local_1c = t;
  _spT_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)n);
  t_00 = local_1c;
  spT_00 = local_20;
  std::operator+((char *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Green Card - Follower. Atakebune: ");
  Follower::Follower(&this->super_Follower,(string *)local_40,t_00,spT_00,3,2,4,3,3,4,local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_40);
  (this->super_Follower).super_GreenCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_0012b790;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->cardText);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->cost = 3;
  this->tapped = false;
  this->attackBonus = 2;
  this->defenseBonus = 4;
  this->minimumHonor = 3;
  this->effectBonus = 3;
  this->effectCost = 4;
  std::operator+((char *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Green Card - Follower. Atakebune: ");
  std::__cxx11::string::operator=((string *)&this->cardText,local_90);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

Atakebune::Atakebune(string n, int t, int spT) : Follower{n, t, spT, 3, 2, 4, 3, 3, 4, "Green Card - Follower. Atakebune: "+ n}
{
    name = n;
    cost = 3;
    tapped = false;

    attackBonus = 2;
    defenseBonus = 4;
    minimumHonor = 3;
    effectBonus = 3;
    effectCost = 4;
    cardText = "Green Card - Follower. Atakebune: " + name;
}